

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisefuture.h
# Opt level: O0

void QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
               (QFuture<void> *future,QPromiseResolve<void> *resolve,QPromiseReject<void> *reject)

{
  QFutureWatcher<void> *this;
  QFutureWatcher<void> *local_58;
  QPromiseReject<void> local_50;
  QPromiseResolve<void> local_48;
  Object local_40 [24];
  QFutureWatcher<void> *local_28;
  Watcher *watcher;
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  QFuture<void> *future_local;
  
  watcher = (Watcher *)reject;
  reject_local = (QPromiseReject<void> *)resolve;
  resolve_local = (QPromiseResolve<void> *)future;
  this = (QFutureWatcher<void> *)operator_new(0x20);
  QFutureWatcher<void>::QFutureWatcher(this,(QObject *)0x0);
  local_58 = this;
  local_28 = this;
  QtPromise::QPromiseReject<void>::QPromiseReject(&local_50,(QPromiseReject<void> *)watcher);
  QtPromise::QPromiseResolve<void>::QPromiseResolve(&local_48,(QPromiseResolve<void> *)reject_local)
  ;
  QObject::
  connect<void(QFutureWatcherBase::*)(),QtPromisePrivate::PromiseFulfill<QFuture<void>>::call(QFuture<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda()_1_>
            (local_40,(offset_in_QFutureWatcherBase_to_subr)this,
             (anon_class_24_3_24552672_for_function *)QFutureWatcherBase::finished);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  PromiseFulfill<QFuture<void>>::
  call(QFuture<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~QPromiseReject((_lambda___1_ *)&local_58);
  QFutureWatcher<void>::setFuture(local_28,(QFuture<void> *)resolve_local);
  return;
}

Assistant:

static void call(const QFuture<void>& future,
                     const QtPromise::QPromiseResolve<void>& resolve,
                     const QtPromise::QPromiseReject<void>& reject)
    {
        using Watcher = QFutureWatcher<void>;

        Watcher* watcher = new Watcher{};
        QObject::connect(watcher, &Watcher::finished, [=]() mutable {
            try {
                if (watcher->isCanceled()) {
                    // let's rethrown potential exception
                    watcher->waitForFinished();
                    reject(QtPromise::QPromiseCanceledException{});
                } else {
                    resolve();
                }
            } catch (...) {
                reject(std::current_exception());
            }

            watcher->deleteLater();
        });

        watcher->setFuture(future);
    }